

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::Model::set_allocated_dictvectorizer
          (Model *this,DictVectorizer *dictvectorizer)

{
  Arena *message_arena_00;
  Arena *submessage_arena_00;
  Arena *submessage_arena;
  Arena *message_arena;
  DictVectorizer *dictvectorizer_local;
  Model *this_local;
  
  message_arena_00 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  clear_Type(this);
  if (dictvectorizer != (DictVectorizer *)0x0) {
    submessage_arena_00 =
         google::protobuf::Arena::InternalHelper<google::protobuf::MessageLite>::GetOwningArena
                   (&dictvectorizer->super_MessageLite);
    message_arena = (Arena *)dictvectorizer;
    if (message_arena_00 != submessage_arena_00) {
      message_arena =
           (Arena *)google::protobuf::internal::
                    GetOwnedMessage<CoreML::Specification::DictVectorizer>
                              (message_arena_00,dictvectorizer,submessage_arena_00);
    }
    set_has_dictvectorizer(this);
    (this->Type_).pipelineclassifier_ = (PipelineClassifier *)message_arena;
  }
  return;
}

Assistant:

void Model::set_allocated_dictvectorizer(::CoreML::Specification::DictVectorizer* dictvectorizer) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_Type();
  if (dictvectorizer) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
        ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<
            ::PROTOBUF_NAMESPACE_ID::MessageLite>::GetOwningArena(
                reinterpret_cast<::PROTOBUF_NAMESPACE_ID::MessageLite*>(dictvectorizer));
    if (message_arena != submessage_arena) {
      dictvectorizer = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, dictvectorizer, submessage_arena);
    }
    set_has_dictvectorizer();
    Type_.dictvectorizer_ = dictvectorizer;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.Model.dictVectorizer)
}